

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlayingState.cpp
# Opt level: O2

void PlayingState::CmdWield
               (string *input,shared_ptr<Connection> *connection,shared_ptr<GameData> *game_data)

{
  element_type *name;
  undefined1 *puVar1;
  Player *pPVar2;
  undefined8 uVar3;
  HandType HVar4;
  ostream *poVar5;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *input_00;
  shared_ptr<Player> player;
  shared_ptr<Item> item;
  shared_ptr<Item> main;
  shared_ptr<Item> main_1;
  shared_ptr<Wieldable> main_hand;
  shared_ptr<Mixin> mixin;
  shared_ptr<Wieldable> wieldable;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  items;
  stringstream ss_1;
  string match;
  stringstream ss;
  Player *local_740;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_738;
  allocator local_729;
  undefined1 local_728 [16];
  undefined1 local_718 [16];
  undefined1 local_708 [40];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_6e0;
  element_type *local_6d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_6d0;
  shared_ptr<Item> local_6c8;
  __shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2> local_6b8;
  __shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2> local_6a8;
  __shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2> local_698;
  __shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2> local_688;
  __shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2> local_678;
  __shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2> local_668;
  shared_ptr<Mixin> local_658;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_648;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_630;
  undefined1 local_618 [16];
  ostream local_608 [376];
  string local_490 [32];
  string local_470;
  string local_450;
  string local_430;
  string local_410;
  string local_3f0;
  string local_3d0;
  string local_3b0;
  string local_390 [32];
  string local_370;
  string local_350 [32];
  string local_330 [32];
  string local_310;
  string local_2f0 [32];
  string local_2d0;
  string local_2b0;
  string local_290 [32];
  string local_270 [32];
  string local_250 [32];
  string local_230 [32];
  string local_210;
  string local_1f0;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  local_1d0;
  stringstream local_1a0 [16];
  ostream local_190 [376];
  
  Connection::GetPlayer((Connection *)&local_740);
  ItemContainer::GetItems_abi_cxx11_
            ((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              *)&local_1d0,&local_740->super_ItemContainer);
  Utils::ExtractMapKeys<std::__cxx11::string,int>(&local_630,(Utils *)&local_1d0,input_00);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  ::~_Rb_tree(&local_1d0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_648,&local_630);
  std::__cxx11::string::string((string *)&local_210,(string *)input);
  Utils::FindMatch(&local_1f0,&local_648,&local_210);
  std::__cxx11::string::~string((string *)&local_210);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_648);
  name = (game_data->super___shared_ptr<GameData,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  std::__cxx11::string::string(local_230,(string *)&local_1f0);
  GameData::GetItem((GameData *)local_728,(string *)name);
  std::__cxx11::string::~string(local_230);
  std::__cxx11::stringstream::stringstream(local_1a0);
  uVar3 = local_728._0_8_;
  if ((Item *)local_728._0_8_ == (Item *)0x0) {
    poVar5 = std::operator<<(local_190,"You do not carry that item!");
    std::operator<<(poVar5,(string *)&Format::NL_abi_cxx11_);
    std::__cxx11::stringbuf::str();
    (**(local_740->super_Entity)._vptr_Entity)(local_740,local_250);
    std::__cxx11::string::~string(local_250);
    goto LAB_0015e4aa;
  }
  std::__cxx11::string::string(local_270,"Wieldable",(allocator *)local_618);
  MixinContainer::GetMixin((MixinContainer *)&local_6d8,(string *)uVar3);
  std::__cxx11::string::~string(local_270);
  if (local_6d8 == (element_type *)0x0) {
    Item::GetItemName_abi_cxx11_((string *)local_618,(Item *)local_728._0_8_);
    poVar5 = std::operator<<(local_190,(string *)local_618);
    poVar5 = std::operator<<(poVar5," can not be wielded!");
    std::operator<<(poVar5,(string *)&Format::NL_abi_cxx11_);
    std::__cxx11::string::~string((string *)local_618);
    std::__cxx11::stringbuf::str();
    (**(local_740->super_Entity)._vptr_Entity)(local_740,local_290);
    std::__cxx11::string::~string(local_290);
  }
  else {
    std::dynamic_pointer_cast<Wieldable,Mixin>(&local_658);
    HVar4 = Wieldable::GetHandType
                      ((Wieldable *)
                       local_658.super___shared_ptr<Mixin,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    switch(HVar4) {
    case MAIN_HAND:
      Player::GetMainHand((Player *)local_718);
      std::__cxx11::stringstream::stringstream((stringstream *)local_618);
      pPVar2 = local_740;
      if ((Item *)local_718._0_8_ != (Item *)0x0) {
        Item::GetItemName_abi_cxx11_(&local_2b0,(Item *)local_718._0_8_);
        ItemContainer::AddItem(&pPVar2->super_ItemContainer,&local_2b0);
        std::__cxx11::string::~string((string *)&local_2b0);
        poVar5 = std::operator<<(local_608,"Removed ");
        Item::GetItemName_abi_cxx11_((string *)local_708,(Item *)local_718._0_8_);
        poVar5 = std::operator<<(poVar5,(string *)local_708);
        std::operator<<(poVar5,(string *)&Format::NL_abi_cxx11_);
        std::__cxx11::string::~string((string *)local_708);
      }
      pPVar2 = local_740;
      std::__shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_668,(__shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2> *)local_728);
      Player::SetMainHand(pPVar2,(shared_ptr<Item> *)&local_668);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_668._M_refcount);
      pPVar2 = local_740;
      Item::GetItemName_abi_cxx11_(&local_2d0,(Item *)local_728._0_8_);
      ItemContainer::RemoveItem(&pPVar2->super_ItemContainer,&local_2d0);
      std::__cxx11::string::~string((string *)&local_2d0);
      poVar5 = std::operator<<(local_608,"Wielding ");
      Item::GetItemName_abi_cxx11_((string *)local_708,(Item *)local_728._0_8_);
      poVar5 = std::operator<<(poVar5,(string *)local_708);
      std::operator<<(poVar5,(string *)&Format::NL_abi_cxx11_);
      std::__cxx11::string::~string((string *)local_708);
      pPVar2 = local_740;
      std::__cxx11::stringbuf::str();
      (**(pPVar2->super_Entity)._vptr_Entity)(pPVar2,local_2f0);
      std::__cxx11::string::~string(local_2f0);
      std::__cxx11::stringstream::~stringstream((stringstream *)local_618);
      puVar1 = local_718;
      goto LAB_0015e457;
    case OFF_HAND:
      Player::GetOffHand((Player *)local_708);
      Player::GetMainHand((Player *)local_718);
      pPVar2 = local_740;
      if ((Item *)local_708._0_8_ != (Item *)0x0) {
        Item::GetItemName_abi_cxx11_(&local_310,(Item *)local_708._0_8_);
        ItemContainer::AddItem(&pPVar2->super_ItemContainer,&local_310);
        std::__cxx11::string::~string((string *)&local_310);
        poVar5 = std::operator<<(local_190,"Removed ");
        Item::GetItemName_abi_cxx11_((string *)local_618,(Item *)local_708._0_8_);
        poVar5 = std::operator<<(poVar5,(string *)local_618);
        std::operator<<(poVar5,(string *)&Format::NL_abi_cxx11_);
        std::__cxx11::string::~string((string *)local_618);
LAB_0015e2bd:
        pPVar2 = local_740;
        std::__shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_678,(__shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2> *)local_728);
        Player::SetOffHand(pPVar2,(shared_ptr<Item> *)&local_678);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_678._M_refcount);
        pPVar2 = local_740;
        Item::GetItemName_abi_cxx11_(&local_370,(Item *)local_728._0_8_);
        ItemContainer::RemoveItem(&pPVar2->super_ItemContainer,&local_370);
        std::__cxx11::string::~string((string *)&local_370);
        poVar5 = std::operator<<(local_190,"Wielding ");
        Item::GetItemName_abi_cxx11_((string *)local_618,(Item *)local_728._0_8_);
        poVar5 = std::operator<<(poVar5,(string *)local_618);
        std::operator<<(poVar5,(string *)&Format::NL_abi_cxx11_);
        goto LAB_0015e43b;
      }
      if ((Item *)local_718._0_8_ == (Item *)0x0) goto LAB_0015e2bd;
      std::__cxx11::string::string(local_330,"Wieldable",&local_729);
      MixinContainer::GetMixin((MixinContainer *)(local_708 + 0x20),(string *)local_718._0_8_);
      std::dynamic_pointer_cast<Wieldable,Mixin>((shared_ptr<Mixin> *)local_618);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_6e0);
      std::__cxx11::string::~string(local_330);
      HVar4 = Wieldable::GetHandType((Wieldable *)local_618._0_8_);
      if (HVar4 != TWO_HAND) {
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_618 + 8));
        goto LAB_0015e2bd;
      }
      poVar5 = std::operator<<(local_190,"Remove two handed weapon before equipping!");
      std::operator<<(poVar5,(string *)&Format::NL_abi_cxx11_);
      std::__cxx11::stringbuf::str();
      (**(local_740->super_Entity)._vptr_Entity)(local_740,local_350);
      std::__cxx11::string::~string(local_350);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_618 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_718 + 8));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_708 + 8));
      goto LAB_0015e493;
    case EITHER_HAND:
      Player::GetMainHand((Player *)local_708);
      Player::GetOffHand((Player *)local_718);
      uVar3 = local_708._0_8_;
      pPVar2 = local_740;
      if ((Item *)local_708._0_8_ == (Item *)0x0) {
        std::__shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_6a8,(__shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2> *)local_728);
        Player::SetMainHand(pPVar2,(shared_ptr<Item> *)&local_6a8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_6a8._M_refcount);
        pPVar2 = local_740;
        Item::GetItemName_abi_cxx11_(&local_410,(Item *)local_728._0_8_);
        ItemContainer::RemoveItem(&pPVar2->super_ItemContainer,&local_410);
        std::__cxx11::string::~string((string *)&local_410);
        poVar5 = std::operator<<(local_190,"Wielding ");
        Item::GetItemName_abi_cxx11_((string *)local_618,(Item *)local_728._0_8_);
        poVar5 = std::operator<<(poVar5,(string *)local_618);
        poVar5 = std::operator<<(poVar5," in main hand");
        std::operator<<(poVar5,(string *)&Format::NL_abi_cxx11_);
        goto LAB_0015e43b;
      }
      std::__cxx11::string::string(local_390,"Wieldable",&local_729);
      MixinContainer::GetMixin((MixinContainer *)local_618,(string *)uVar3);
      std::dynamic_pointer_cast<Wieldable,Mixin>((shared_ptr<Mixin> *)(local_708 + 0x20));
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_618 + 8));
      std::__cxx11::string::~string(local_390);
      if (((Item *)local_718._0_8_ == (Item *)0x0) &&
         (HVar4 = Wieldable::GetHandType((Wieldable *)local_708._32_8_), pPVar2 = local_740,
         HVar4 != TWO_HAND)) {
        std::__shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_688,(__shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2> *)local_728);
        Player::SetOffHand(pPVar2,(shared_ptr<Item> *)&local_688);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_688._M_refcount);
        pPVar2 = local_740;
        Item::GetItemName_abi_cxx11_(&local_3b0,(Item *)local_728._0_8_);
        ItemContainer::RemoveItem(&pPVar2->super_ItemContainer,&local_3b0);
        std::__cxx11::string::~string((string *)&local_3b0);
        poVar5 = std::operator<<(local_190,"Wielding ");
        Item::GetItemName_abi_cxx11_((string *)local_618,(Item *)local_728._0_8_);
        poVar5 = std::operator<<(poVar5,(string *)local_618);
        poVar5 = std::operator<<(poVar5," in off hand");
        std::operator<<(poVar5,(string *)&Format::NL_abi_cxx11_);
      }
      else {
        pPVar2 = local_740;
        std::__shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_698,(__shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2> *)local_728);
        Player::SetMainHand(pPVar2,(shared_ptr<Item> *)&local_698);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_698._M_refcount);
        pPVar2 = local_740;
        Item::GetItemName_abi_cxx11_(&local_3d0,(Item *)local_728._0_8_);
        ItemContainer::RemoveItem(&pPVar2->super_ItemContainer,&local_3d0);
        std::__cxx11::string::~string((string *)&local_3d0);
        pPVar2 = local_740;
        Item::GetItemName_abi_cxx11_(&local_3f0,(Item *)local_708._0_8_);
        ItemContainer::AddItem(&pPVar2->super_ItemContainer,&local_3f0);
        std::__cxx11::string::~string((string *)&local_3f0);
        poVar5 = std::operator<<(local_190,"Unwielded ");
        Item::GetItemName_abi_cxx11_((string *)local_618,(Item *)local_708._0_8_);
        poVar5 = std::operator<<(poVar5,(string *)local_618);
        std::operator<<(poVar5,(string *)&Format::NL_abi_cxx11_);
        std::__cxx11::string::~string((string *)local_618);
        poVar5 = std::operator<<(local_190,"Wielding ");
        Item::GetItemName_abi_cxx11_((string *)local_618,(Item *)local_728._0_8_);
        poVar5 = std::operator<<(poVar5,(string *)local_618);
        poVar5 = std::operator<<(poVar5," in main hand");
        std::operator<<(poVar5,(string *)&Format::NL_abi_cxx11_);
      }
      std::__cxx11::string::~string((string *)local_618);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_6e0);
      break;
    case TWO_HAND:
      Player::GetMainHand((Player *)local_708);
      Player::GetOffHand((Player *)local_718);
      pPVar2 = local_740;
      if ((Item *)local_708._0_8_ != (Item *)0x0) {
        Item::GetItemName_abi_cxx11_(&local_430,(Item *)local_708._0_8_);
        ItemContainer::AddItem(&pPVar2->super_ItemContainer,&local_430);
        std::__cxx11::string::~string((string *)&local_430);
        poVar5 = std::operator<<(local_190,"Unwielded ");
        Item::GetItemName_abi_cxx11_((string *)local_618,(Item *)local_708._0_8_);
        poVar5 = std::operator<<(poVar5,(string *)local_618);
        std::operator<<(poVar5,(string *)&Format::NL_abi_cxx11_);
        std::__cxx11::string::~string((string *)local_618);
      }
      pPVar2 = local_740;
      if ((Item *)local_718._0_8_ != (Item *)0x0) {
        Item::GetItemName_abi_cxx11_(&local_450,(Item *)local_718._0_8_);
        ItemContainer::AddItem(&pPVar2->super_ItemContainer,&local_450);
        std::__cxx11::string::~string((string *)&local_450);
        local_6c8.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
        local_6c8.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        Player::SetOffHand(local_740,&local_6c8);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  (&local_6c8.super___shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
        poVar5 = std::operator<<(local_190,"Unwielded ");
        Item::GetItemName_abi_cxx11_((string *)local_618,(Item *)local_718._0_8_);
        poVar5 = std::operator<<(poVar5,(string *)local_618);
        std::operator<<(poVar5,(string *)&Format::NL_abi_cxx11_);
        std::__cxx11::string::~string((string *)local_618);
      }
      pPVar2 = local_740;
      std::__shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                (&local_6b8,(__shared_ptr<Item,_(__gnu_cxx::_Lock_policy)2> *)local_728);
      Player::SetMainHand(pPVar2,(shared_ptr<Item> *)&local_6b8);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_6b8._M_refcount);
      pPVar2 = local_740;
      Item::GetItemName_abi_cxx11_(&local_470,(Item *)local_728._0_8_);
      ItemContainer::RemoveItem(&pPVar2->super_ItemContainer,&local_470);
      std::__cxx11::string::~string((string *)&local_470);
      poVar5 = std::operator<<(local_190,"Wielding ");
      Item::GetItemName_abi_cxx11_((string *)local_618,(Item *)local_728._0_8_);
      poVar5 = std::operator<<(poVar5,(string *)local_618);
      poVar5 = std::operator<<(poVar5," in main hand");
      std::operator<<(poVar5,(string *)&Format::NL_abi_cxx11_);
LAB_0015e43b:
      std::__cxx11::string::~string((string *)local_618);
      break;
    default:
      goto switchD_0015db14_default;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_718 + 8));
    puVar1 = local_708;
LAB_0015e457:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar1 + 8));
switchD_0015db14_default:
    std::__cxx11::stringbuf::str();
    (**(local_740->super_Entity)._vptr_Entity)(local_740,local_490);
    std::__cxx11::string::~string(local_490);
LAB_0015e493:
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_658.super___shared_ptr<Mixin,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_6d0);
LAB_0015e4aa:
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_728 + 8));
  std::__cxx11::string::~string((string *)&local_1f0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_630);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_738);
  return;
}

Assistant:

void PlayingState::CmdWield(const std::string &input, std::shared_ptr<Connection> connection,
                            std::shared_ptr<GameData> game_data) {
    auto player = connection->GetPlayer();
    auto items = Utils::ExtractMapKeys(player->GetItems());
    std::string match = Utils::FindMatch(items, input);
    auto item = game_data->GetItem(match);
    std::stringstream ss;
    if(item == nullptr) {
        ss << "You do not carry that item!" << Format::NL;
        player->Send(ss.str());
        return;
    }
    auto mixin = item->GetMixin("Wieldable");
    if(mixin == nullptr) {
        ss << item->GetItemName() << " can not be wielded!" << Format::NL;
        player->Send(ss.str());
        return;
    }
    auto wieldable = std::dynamic_pointer_cast<Wieldable>(mixin);
    auto hand = wieldable->GetHandType();
    if(hand == MAIN_HAND) {
        auto main = player->GetMainHand();
        std::stringstream ss;
        if (main != nullptr) {
            player->AddItem(main->GetItemName());
            ss << "Removed " << main->GetItemName() << Format::NL;
        }
        player->SetMainHand(item);
        player->RemoveItem(item->GetItemName());
        ss << "Wielding " << item->GetItemName() << Format::NL;
        player->Send(ss.str());
    }
    else if(hand == OFF_HAND) {
        auto off = player->GetOffHand();
        auto main = player->GetMainHand();
        if(off != nullptr) {
            player->AddItem(off->GetItemName());
            ss << "Removed " << off->GetItemName() << Format::NL;
        }
        else if(main != nullptr) {
            auto main_hand = std::dynamic_pointer_cast<Wieldable>(main->GetMixin("Wieldable"));
            if (main_hand->GetHandType() == TWO_HAND) {
                ss << "Remove two handed weapon before equipping!" << Format::NL;
                player->Send(ss.str());
                return;
            }
        }
        player->SetOffHand(item);
        player->RemoveItem(item->GetItemName());
        ss << "Wielding " << item->GetItemName() << Format::NL;
    }
    else if(hand == EITHER_HAND) {
        auto main = player->GetMainHand();
        auto off = player->GetOffHand();
        if(main != nullptr) {
            auto main_hand = std::dynamic_pointer_cast<Wieldable>(main->GetMixin("Wieldable"));
            if(off == nullptr and main_hand->GetHandType() != TWO_HAND) {
                player->SetOffHand(item);
                player->RemoveItem(item->GetItemName());
                ss << "Wielding " << item->GetItemName() << " in off hand" << Format::NL;
            }
            else {
                player->SetMainHand(item);
                player->RemoveItem(item->GetItemName());
                player->AddItem(main->GetItemName());
                ss << "Unwielded " << main->GetItemName() << Format::NL;
                ss << "Wielding " << item->GetItemName() << " in main hand" << Format::NL;
            }
        }
        else {
            player->SetMainHand(item);
            player->RemoveItem(item->GetItemName());
            ss << "Wielding " << item->GetItemName() << " in main hand" << Format::NL;
        }
    }
    else if(hand == TWO_HAND) {
        auto main = player->GetMainHand();
        auto off = player->GetOffHand();
        if(main != nullptr) {
            player->AddItem(main->GetItemName());
            ss << "Unwielded " << main->GetItemName() << Format::NL;
        }
        if(off != nullptr) {
            player->AddItem(off->GetItemName());
            player->SetOffHand(nullptr);
            ss << "Unwielded " << off->GetItemName() << Format::NL;
        }
        player->SetMainHand(item);
        player->RemoveItem(item->GetItemName());
        ss << "Wielding " << item->GetItemName() << " in main hand" << Format::NL;
    }
    player->Send(ss.str());
}